

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NotificationDispatcher.cpp
# Opt level: O2

shared_ptr<Notification> __thiscall
NotificationDispatcher::Find(NotificationDispatcher *this,uint32_t hNotify)

{
  iterator iVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  long lVar2;
  shared_ptr<Notification> sVar3;
  key_type local_24;
  
  lVar2 = CONCAT44(in_register_00000034,hNotify);
  std::recursive_mutex::lock((recursive_mutex *)&((pthread_mutex_t *)(lVar2 + 0x70))->__data);
  iVar1 = std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<Notification>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::shared_ptr<Notification>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<Notification>_>_>_>
          ::find((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<Notification>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::shared_ptr<Notification>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<Notification>_>_>_>
                  *)(lVar2 + 0x40),&local_24);
  if (iVar1._M_node == (_Base_ptr)(lVar2 + 0x48)) {
    *(undefined8 *)&(this->deleteNotification).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(this->deleteNotification).super__Function_base._M_functor + 8) = 0;
  }
  else {
    std::__shared_ptr<Notification,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<Notification,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<Notification,_(__gnu_cxx::_Lock_policy)2> *)&iVar1._M_node[1]._M_parent
              );
  }
  pthread_mutex_unlock((pthread_mutex_t *)(lVar2 + 0x70));
  sVar3.super___shared_ptr<Notification,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<Notification,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Notification>)
         sVar3.super___shared_ptr<Notification,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Notification> NotificationDispatcher::Find(uint32_t hNotify)
{
    std::lock_guard<std::recursive_mutex> lock(mutex);
    auto it = notifications.find(hNotify);
    if (it != notifications.end()) {
        return it->second;
    }
    return {};
}